

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O2

bool __thiscall
BamTools::Internal::BamReaderPrivate::GetNextAlignment
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  bool bVar1;
  string message;
  string alError;
  allocator local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  bVar1 = GetNextAlignmentCore(this,alignment);
  if (bVar1) {
    std::__cxx11::string::_M_assign((string *)&alignment->Filename);
    bVar1 = BamAlignment::BuildCharData(alignment);
    if (bVar1) {
      return true;
    }
    BamAlignment::GetErrorString_abi_cxx11_(&local_30,alignment);
    std::__cxx11::string::string
              ((string *)&local_70,"could not populate alignment data: \n\t",&local_71);
    std::operator+(&local_50,&local_70,&local_30);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::string((string *)&local_70,"BamReader::GetNextAlignment",&local_71);
    SetErrorString(this,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return false;
}

Assistant:

bool BamReaderPrivate::GetNextAlignment(BamAlignment& alignment)
{

    // if valid alignment found
    if (GetNextAlignmentCore(alignment)) {

        // store alignment's "source" filename
        alignment.Filename = m_filename;

        // return success/failure of parsing char data
        if (alignment.BuildCharData())
            return true;
        else {
            const std::string alError = alignment.GetErrorString();
            const std::string message =
                std::string("could not populate alignment data: \n\t") + alError;
            SetErrorString("BamReader::GetNextAlignment", message);
            return false;
        }
    }

    // no valid alignment found
    return false;
}